

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::MergeFrom
          (BiDirectionalLSTMLayerParams *this,BiDirectionalLSTMLayerParams *from)

{
  bool bVar1;
  LogMessage *other;
  LSTMParams *this_00;
  LSTMParams *from_00;
  uint64_t uVar2;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  BiDirectionalLSTMLayerParams *local_18;
  BiDirectionalLSTMLayerParams *from_local;
  BiDirectionalLSTMLayerParams *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x90c6);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::MergeFrom
            (&this->activationsforwardlstm_,&local_18->activationsforwardlstm_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::MergeFrom
            (&this->activationsbackwardlstm_,&local_18->activationsbackwardlstm_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::MergeFrom
            (&this->weightparams_,&local_18->weightparams_);
  bVar1 = _internal_has_params(local_18);
  if (bVar1) {
    this_00 = _internal_mutable_params(this);
    from_00 = _internal_params(local_18);
    LSTMParams::MergeFrom(this_00,from_00);
  }
  uVar2 = _internal_inputvectorsize(local_18);
  if (uVar2 != 0) {
    uVar2 = _internal_inputvectorsize(local_18);
    _internal_set_inputvectorsize(this,uVar2);
  }
  uVar2 = _internal_outputvectorsize(local_18);
  if (uVar2 != 0) {
    uVar2 = _internal_outputvectorsize(local_18);
    _internal_set_outputvectorsize(this,uVar2);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void BiDirectionalLSTMLayerParams::MergeFrom(const BiDirectionalLSTMLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.BiDirectionalLSTMLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  activationsforwardlstm_.MergeFrom(from.activationsforwardlstm_);
  activationsbackwardlstm_.MergeFrom(from.activationsbackwardlstm_);
  weightparams_.MergeFrom(from.weightparams_);
  if (from._internal_has_params()) {
    _internal_mutable_params()->::CoreML::Specification::LSTMParams::MergeFrom(from._internal_params());
  }
  if (from._internal_inputvectorsize() != 0) {
    _internal_set_inputvectorsize(from._internal_inputvectorsize());
  }
  if (from._internal_outputvectorsize() != 0) {
    _internal_set_outputvectorsize(from._internal_outputvectorsize());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}